

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O0

void gen_stxsspx(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t n;
  TCGv_i64 dst;
  TCGv_i64 EA_00;
  TCGv_i64 t0;
  TCGv_i64 EA;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->vsx_enabled ^ 0xffU) & 1) == 0) {
    dst = tcg_temp_new_i64(tcg_ctx_00);
    gen_set_access_type(ctx,0x20);
    EA_00 = tcg_temp_new_i64(tcg_ctx_00);
    gen_addr_reg_index(ctx,EA_00);
    n = xS(ctx->opcode);
    get_cpu_vsrh(tcg_ctx_00,dst,n);
    gen_qemu_st32fs(ctx,dst,EA_00);
    tcg_temp_free_i64(tcg_ctx_00,EA_00);
    tcg_temp_free_i64(tcg_ctx_00,dst);
  }
  else {
    gen_exception(ctx,0x5e);
  }
  return;
}

Assistant:

static void gen_stxvd2x(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 t0;
    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    t0 = tcg_temp_new_i64(tcg_ctx);
    gen_set_access_type(ctx, ACCESS_INT);
    EA = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    get_cpu_vsrh(tcg_ctx, t0, xS(ctx->opcode));
    gen_qemu_st64_i64(ctx, t0, EA);
    tcg_gen_addi_tl(tcg_ctx, EA, EA, 8);
    get_cpu_vsrl(tcg_ctx, t0, xS(ctx->opcode));
    gen_qemu_st64_i64(ctx, t0, EA);
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, t0);
}